

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O2

int lzo1x_1_compress(uchar *in,lzo_uint in_len,uchar *out,lzo_uint *out_len,void *wrkmem)

{
  byte bVar1;
  lzo_uint lVar2;
  long lVar3;
  uchar *puVar4;
  uchar *puVar5;
  ulong uVar6;
  
  lVar2 = in_len;
  puVar4 = out;
  if (0xd < in_len) {
    lVar2 = _lzo1x_1_do_compress(in,in_len,out,out_len,wrkmem);
    puVar4 = out + *out_len;
  }
  if (lVar2 != 0) {
    bVar1 = (byte)lVar2;
    if (lVar2 < 0xef && puVar4 == out) {
      puVar4 = out + 1;
      *out = bVar1 + 0x11;
    }
    else if (lVar2 < 4) {
      puVar4[-2] = puVar4[-2] | bVar1;
    }
    else if (lVar2 < 0x13) {
      *puVar4 = bVar1 - 3;
      puVar4 = puVar4 + 1;
    }
    else {
      uVar6 = lVar2 + 0xed;
      puVar4 = puVar4 + 1;
      do {
        puVar5 = puVar4;
        puVar5[-1] = '\0';
        puVar4 = puVar5 + 1;
        uVar6 = uVar6 - 0xff;
      } while (0xff < uVar6);
      *puVar5 = (uchar)uVar6;
    }
    lVar3 = -lVar2;
    do {
      *puVar4 = in[lVar3 + in_len];
      puVar4 = puVar4 + 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  puVar4[0] = '\x11';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  *out_len = (lzo_uint)(puVar4 + (3 - (long)out));
  return 0;
}

Assistant:

LZO_PUBLIC(int)
DO_COMPRESS      ( const lzo_bytep in , lzo_uint  in_len,
                         lzo_bytep out, lzo_uintp out_len,
                         lzo_voidp wrkmem )
{
    lzo_bytep op = out;
    lzo_uint t;

    if __lzo_unlikely(in_len <= M2_MAX_LEN + 5)
        t = in_len;
    else
    {
        t = do_compress(in,in_len,op,out_len,wrkmem);
        op += *out_len;
    }